

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HighbdDrPredTest_SaturatedValues_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::HighbdDrPredTest_SaturatedValues_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::DrPredFunc<void(*)(unsigned_short*,long,int,int,unsigned_short_const*,unsigned_short_const*,int,int,int,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x60);
  anon_unknown.dwarf_5564d0::HighbdDrPredTest::HighbdDrPredTest((HighbdDrPredTest *)this_00);
  (((DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
     *)&this_00->_vptr_Test)->
  super_TestWithParam<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00ef6a40;
  this_00[1]._vptr_Test = (_func_int **)&PTR__HighbdDrPredTest_SaturatedValues_Test_00ef6a80;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }